

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O2

void zt_log_lvprintf(zt_log_ty *log,zt_log_level level,char *fmt,__va_list_tag *ap)

{
  zt_log_ctx_ty *pzVar1;
  
  if (log == (zt_log_ty *)0x0) {
    log = zt_log_get_logger();
    if (log == (zt_log_ty *)0x0) goto LAB_001039d0;
  }
  if ((level <= log->level) &&
     (log->vtbl->print !=
      (_func_void_zt_log_ty_ptr_zt_log_level_char_ptr_int_char_ptr_char_ptr___va_list_tag_ptr *)0x0)
     ) {
    pzVar1 = zt_log_get_ctx();
    (*log->vtbl->print)(log,level,pzVar1->file,pzVar1->line,pzVar1->function,fmt,ap);
  }
LAB_001039d0:
  pzVar1 = zt_log_get_ctx();
  pzVar1->file = (char *)0x0;
  pzVar1->line = -1;
  pzVar1->function = (char *)0x0;
  return;
}

Assistant:

void
zt_log_lvprintf(zt_log_ty * log, zt_log_level level, const char * fmt, va_list ap) {
    if (!log && ((log = zt_log_get_logger()) == NULL)) {
        goto EXIT;
    }

    if (level > log->level) {
        goto EXIT;
    }

    if (log->vtbl->print) {
        zt_log_ctx_ty   * ctx = zt_log_get_ctx();
        log->vtbl->print(log, level,
                         ctx ? ctx->file : NULL,
                         ctx ? ctx->line : 0,
                         ctx ? ctx->function : NULL,
                         fmt, ap);
    }

EXIT:
    /* debug info is only valid for a single call */
    zt_log_set_debug_info(NULL, -1, NULL);
}